

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O1

void __thiscall AudioLogger::Data::Data(Data *this)

{
  long lVar1;
  long lVar2;
  
  this->deviceIdIn = 0;
  this->sampleSize_bytes = -1;
  lVar2 = 0;
  this->bufferId = 0;
  this->nRecords = 0;
  memset(&this->records,0,0x1a0);
  (this->parameters).captureId = -1;
  (this->parameters).nChannels = -1;
  *(undefined4 *)&(this->parameters).sampleRate = 0xffffffff;
  *(undefined4 *)((long)&(this->parameters).sampleRate + 4) = 0xffffffff;
  (this->parameters).sampleType = F32SYS;
  (this->parameters).filter = FirstOrderHighPass;
  (this->parameters).freqCutoff_Hz = 1000.0;
  (this->filterCoefficients).a0 = 0.0;
  (this->filterCoefficients).a1 = 0.0;
  (this->filterCoefficients).a2 = 0.0;
  (this->filterCoefficients).b1 = 0.0;
  (this->filterCoefficients).b2 = 0.0;
  (this->filterCoefficients).c0 = 0.0;
  (this->filterCoefficients).d0 = 0.0;
  (this->filterCoefficients).xnz1 = 0.0;
  (this->filterCoefficients).xnz1 = 0.0;
  (this->filterCoefficients).xnz2 = 0.0;
  (this->filterCoefficients).ynz1 = 0.0;
  (this->filterCoefficients).ynz2 = 0.0;
  memset(&this->buffer,0,0x1d5800);
  *(undefined1 (*) [16])&(this->mutex).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->mutex).super___mutex_base._M_mutex.__data.__list.__prev + 1)
       = (undefined1  [16])0x0;
  do {
    lVar1 = *(long *)((long)&(this->records)._M_elems[0].
                             super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar2);
    if (*(long *)((long)&(this->records)._M_elems[0].
                         super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar2) != lVar1) {
      *(long *)((long)&(this->records)._M_elems[0].
                       super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + lVar2) = lVar1;
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x180);
  (this->nFramesToRecord)._M_elems[0xc] = 0;
  (this->nFramesToRecord)._M_elems[0xd] = 0;
  (this->nFramesToRecord)._M_elems[0xe] = 0;
  (this->nFramesToRecord)._M_elems[0xf] = 0;
  (this->nFramesToRecord)._M_elems[8] = 0;
  (this->nFramesToRecord)._M_elems[9] = 0;
  (this->nFramesToRecord)._M_elems[10] = 0;
  (this->nFramesToRecord)._M_elems[0xb] = 0;
  (this->nFramesToRecord)._M_elems[4] = 0;
  (this->nFramesToRecord)._M_elems[5] = 0;
  (this->nFramesToRecord)._M_elems[6] = 0;
  (this->nFramesToRecord)._M_elems[7] = 0;
  (this->nFramesToRecord)._M_elems[0] = 0;
  (this->nFramesToRecord)._M_elems[1] = 0;
  (this->nFramesToRecord)._M_elems[2] = 0;
  (this->nFramesToRecord)._M_elems[3] = 0;
  return;
}

Assistant:

Data() : isReady(false) {
        for (auto & frame : buffer) {
            frame.fill(0);
        }

        for (auto & record : records) {
            record.clear();
        }

        nFramesToRecord.fill(0);
    }